

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batched_data_collection.cpp
# Opt level: O0

void __thiscall
duckdb::BatchCollectionChunkScanState::InternalLoad
          (BatchCollectionChunkScanState *this,ErrorData *error)

{
  bool bVar1;
  pointer this_00;
  BatchedDataCollection *in_RSI;
  BatchedChunkScanState *in_RDI;
  DataChunk *in_stack_00000040;
  unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>
  *in_stack_ffffffffffffffe0;
  DataChunk *output;
  
  bVar1 = ::std::operator==((_Self *)&(in_RDI->scan_state).current_chunk_state.handles._M_h.
                                      _M_element_count,
                            (_Self *)&(in_RDI->scan_state).current_chunk_state.handles._M_h.
                                      _M_rehash_policy);
  if (bVar1) {
    this_00 = unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::
              operator->(in_stack_ffffffffffffffe0);
    DataChunk::SetCardinality(this_00,0);
  }
  else {
    (in_RDI->range).end._M_node = (_Base_ptr)0x0;
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator->
              (in_stack_ffffffffffffffe0);
    DataChunk::Reset(in_stack_00000040);
    output = (DataChunk *)&(in_RDI->scan_state).current_chunk_state.handles._M_h._M_element_count;
    unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true>::operator*
              ((unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>,_true> *)output
              );
    BatchedDataCollection::Scan(in_RSI,in_RDI,output);
  }
  return;
}

Assistant:

void BatchCollectionChunkScanState::InternalLoad(ErrorData &error) {
	if (state.range.begin == state.range.end) {
		// Signal empty chunk to break out of the loop
		current_chunk->SetCardinality(0);
		return;
	}
	offset = 0;
	current_chunk->Reset();
	collection.Scan(state, *current_chunk);
	return;
}